

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O3

size_t ht_registry_push_registry_klasses_to_listener
                 (HT_TimelineListenerCallback callback,void *listener,HT_Boolean serialize)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  HT_EventIdProvider *pHVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  HT_EventKlassInfoEvent event;
  HT_Byte data [4096];
  size_t local_10c0;
  HT_Event local_10a8;
  undefined4 local_1090;
  undefined8 local_1088;
  undefined1 local_1080;
  HT_Event local_1078;
  undefined4 local_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined1 local_1040;
  uint8_t local_1038 [4104];
  
  ht_mutex_lock(event_klass_registry_register_mutex);
  if (event_klass_register.size == 0) {
    ht_mutex_unlock(event_klass_registry_register_mutex);
    sVar9 = 0;
  }
  else {
    sVar9 = 0;
    uVar8 = 0;
    sVar7 = 0;
    do {
      plVar2 = (long *)event_klass_register.data[uVar8];
      local_10a8.klass = ht_HT_EventKlassInfoEvent_get_event_klass_instance();
      pHVar5 = ht_event_id_provider_get_default();
      local_10a8.id = ht_event_id_provider_next(pHVar5);
      local_10a8.timestamp = ht_monotonic_clock_get_timestamp();
      local_1088 = *(undefined8 *)*plVar2;
      local_1090 = (undefined4)plVar2[3];
      local_1080 = *(undefined1 *)((undefined8 *)*plVar2 + 1);
      sVar6 = ht_HT_EventKlassInfoEvent_get_size(&local_10a8);
      if (0x1000 - sVar7 < sVar6) {
        (*callback)(local_1038,sVar7,serialize,listener);
        sVar6 = 0;
        local_10c0 = sVar7;
      }
      else {
        local_10c0 = 0;
        sVar6 = sVar7;
      }
      sVar7 = ht_event_utils_serialize_event_to_buffer(&local_10a8,local_1038 + sVar6,serialize);
      sVar7 = sVar7 + sVar6;
      if (*(long *)(*plVar2 + 8) != 0) {
        lVar11 = 0x28;
        uVar10 = 0;
        do {
          local_1078.klass = ht_HT_EventKlassFieldInfoEvent_get_event_klass_instance();
          lVar3 = *(long *)(*plVar2 + 0x20);
          pHVar5 = ht_event_id_provider_get_default();
          local_1078.id = ht_event_id_provider_next(pHVar5);
          local_1078.timestamp = ht_monotonic_clock_get_timestamp();
          iVar4 = *(int *)(lVar3 + lVar11);
          if ((iVar4 == 3) && (*(int *)(lVar3 + -8 + lVar11) == 0)) {
            iVar4 = 99;
          }
          local_1040 = (undefined1)iVar4;
          local_1060 = (undefined4)plVar2[3];
          puVar1 = (undefined8 *)(lVar3 + -0x28 + lVar11);
          local_1058 = *puVar1;
          uStack_1050 = puVar1[1];
          local_1048 = *(undefined8 *)(lVar3 + -0x18 + lVar11);
          sVar6 = ht_HT_EventKlassFieldInfoEvent_get_size(&local_1078);
          if (0x1000 - sVar7 < sVar6) {
            (*callback)(local_1038,sVar7,serialize,listener);
            local_10c0 = local_10c0 + sVar7;
            sVar7 = 0;
          }
          sVar6 = ht_event_utils_serialize_event_to_buffer(&local_1078,local_1038 + sVar7,serialize)
          ;
          sVar7 = sVar7 + sVar6;
          uVar10 = uVar10 + 1;
          lVar11 = lVar11 + 0x30;
        } while (uVar10 < *(ulong *)(*plVar2 + 8));
      }
      sVar9 = sVar9 + local_10c0;
      uVar8 = uVar8 + 1;
    } while (uVar8 < event_klass_register.size);
    ht_mutex_unlock(event_klass_registry_register_mutex);
    if (sVar7 != 0) {
      (*callback)(local_1038,sVar7,serialize,listener);
      sVar9 = sVar9 + sVar7;
    }
  }
  return sVar9;
}

Assistant:

size_t
ht_registry_push_registry_klasses_to_listener(HT_TimelineListenerCallback callback, void* listener, HT_Boolean serialize)
{
    size_t i;
    size_t total_size = 0;

    HT_Byte data[REGISTRY_LISETNER_BUFF_SIZE];
    size_t data_pos = 0;

    ht_mutex_lock(event_klass_registry_register_mutex);

    for (i = 0; i < event_klass_register.size; i++)
    {
        total_size += _ht_registry_push_class_to_listener((HT_EventKlass*)event_klass_register.data[i], data, &data_pos, callback, listener, serialize);
    }

    ht_mutex_unlock(event_klass_registry_register_mutex);

    if (data_pos > 0)
    {
        callback(data, data_pos, serialize, listener);
        total_size += data_pos;
    }

    return total_size;
}